

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateResourceMapping
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,
          ResourceMappingCreateInfo *ResMappingCI,IResourceMapping **ppMapping)

{
  Char *pCVar1;
  IMemoryAllocator *CtorArgs;
  undefined1 local_f0 [8];
  string msg_3;
  ResourceMappingEntry *Entry;
  undefined1 local_c0 [4];
  Uint32 i;
  ResourceMappingImpl *local_98;
  ResourceMappingImpl *pResourceMapping;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  IResourceMapping **ppMapping_local;
  ResourceMappingCreateInfo *ResMappingCI_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = ppMapping;
  if (ppMapping == (IResourceMapping **)0x0) {
    FormatString<char[22]>((string *)local_40,(char (*) [22])"Null pointer provided");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"CreateResourceMapping",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xeb);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (msg.field_2._8_8_ != 0) {
    if (*(long *)msg.field_2._8_8_ != 0) {
      FormatString<char[64]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [64])"Overwriting reference to existing object may cause memory leaks");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CreateResourceMapping",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0xee);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if ((ResMappingCI->pEntries != (ResourceMappingEntry *)0x0) && (ResMappingCI->NumEntries == 0))
    {
      FormatString<char[89]>
                ((string *)&pResourceMapping,
                 (char (*) [89])
                 "Starting with API253010, the number of entries is defined through the NumEntries member."
                );
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CreateResourceMapping",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0xef);
      std::__cxx11::string::~string((string *)&pResourceMapping);
    }
    MakeNewRCObj<Diligent::ResourceMappingImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
              ((MakeNewRCObj<Diligent::ResourceMappingImpl,_Diligent::FixedBlockMemoryAllocator> *)
               local_c0,&this->m_ResMappingAllocator,"ResourceMappingImpl instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xf1,(IObject *)0x0);
    CtorArgs = GetRawAllocator();
    local_98 = MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>::
               operator()((MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>
                           *)local_c0,CtorArgs);
    (**(local_98->super_ObjectBase<Diligent::IResourceMapping>).
       super_RefCountedObject<Diligent::IResourceMapping>.super_IResourceMapping.super_IObject.
       _vptr_IObject)(local_98,IID_ResourceMapping,msg.field_2._8_8_);
    if (ResMappingCI->pEntries != (ResourceMappingEntry *)0x0) {
      for (Entry._4_4_ = 0; Entry._4_4_ < ResMappingCI->NumEntries; Entry._4_4_ = Entry._4_4_ + 1) {
        msg_3.field_2._8_8_ = ResMappingCI->pEntries + Entry._4_4_;
        if ((((ResourceMappingEntry *)msg_3.field_2._8_8_)->Name == (Char *)0x0) ||
           (((ResourceMappingEntry *)msg_3.field_2._8_8_)->pObject == (IDeviceObject *)0x0)) {
          FormatString<char[134]>
                    ((string *)local_f0,
                     (char (*) [134])
                     "Name and pObject must not be null. Note that starting with API253010, the number of entries is defined through the NumEntries member."
                    );
          pCVar1 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar1,"CreateResourceMapping",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                     ,0xfb);
          std::__cxx11::string::~string((string *)local_f0);
        }
        else {
          (**(code **)(**(long **)msg.field_2._8_8_ + 0x28))
                    (*(long **)msg.field_2._8_8_,((ResourceMappingEntry *)msg_3.field_2._8_8_)->Name
                     ,((ResourceMappingEntry *)msg_3.field_2._8_8_)->ArrayIndex,
                     &((ResourceMappingEntry *)msg_3.field_2._8_8_)->pObject,1);
        }
      }
    }
  }
  return;
}

Assistant:

CreateResourceMapping(const ResourceMappingCreateInfo& ResMappingCI, IResourceMapping** ppMapping) override final
    {
        DEV_CHECK_ERR(ppMapping != nullptr, "Null pointer provided");
        if (ppMapping == nullptr)
            return;
        DEV_CHECK_ERR(*ppMapping == nullptr, "Overwriting reference to existing object may cause memory leaks");
        DEV_CHECK_ERR(ResMappingCI.pEntries == nullptr || ResMappingCI.NumEntries != 0, "Starting with API253010, the number of entries is defined through the NumEntries member.");

        ResourceMappingImpl* pResourceMapping{NEW_RC_OBJ(m_ResMappingAllocator, "ResourceMappingImpl instance", ResourceMappingImpl)(GetRawAllocator())};
        pResourceMapping->QueryInterface(IID_ResourceMapping, reinterpret_cast<IObject**>(ppMapping));
        if (ResMappingCI.pEntries != nullptr)
        {
            for (Uint32 i = 0; i < ResMappingCI.NumEntries; ++i)
            {
                const ResourceMappingEntry& Entry = ResMappingCI.pEntries[i];
                if (Entry.Name != nullptr && Entry.pObject != nullptr)
                    (*ppMapping)->AddResourceArray(Entry.Name, Entry.ArrayIndex, &Entry.pObject, 1, true);
                else
                    DEV_ERROR("Name and pObject must not be null. Note that starting with API253010, the number of entries is defined through the NumEntries member.");
            }
        }
    }